

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBuildVisitor.cpp
# Opt level: O1

void __thiscall CBuildVisitor::Visit(CBuildVisitor *this,CNumExp *expression)

{
  ISubtreeWrapper *pIVar1;
  ISubtreeWrapper *pIVar2;
  CConstExpression *this_00;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"IRT builder: CNumExp\n",0x15);
  pIVar2 = (ISubtreeWrapper *)operator_new(0x10);
  this_00 = (CConstExpression *)operator_new(0x10);
  IRT::CConstExpression::CConstExpression(this_00,expression->number);
  pIVar2->_vptr_ISubtreeWrapper = (_func_int **)&PTR_ToExpression_00183490;
  pIVar2[1]._vptr_ISubtreeWrapper = (_func_int **)this_00;
  pIVar1 = (this->wrapper)._M_t.
           super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>.
           _M_t.
           super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
           .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl;
  (this->wrapper)._M_t.
  super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
  super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
  super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl = pIVar2;
  if (pIVar1 != (ISubtreeWrapper *)0x0) {
    operator_delete(pIVar1);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&this->currentObjectClassName,0,
             (char *)(this->currentObjectClassName)._M_string_length,0x15c41a);
  return;
}

Assistant:

void CBuildVisitor::Visit( CNumExp &expression ) {
    std::cout << "IRT builder: CNumExp\n";
    updateSubtreeWrapper( new IRT::CExpressionWrapper(
            new IRT::CConstExpression( expression.number )
    ));

    currentObjectClassName = "";
}